

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar1 = secp256k1_scalar_is_zero(s);
  if (iVar1 == 0) {
    uVar10 = ~(uint)s->d[0] & 1;
    uVar2 = secp256k1_scalar_get_bits_var(s,0,w);
    *wnaf = uVar2 + uVar10;
    uVar9 = (w + 0x7f) / w - 1;
    uVar7 = uVar9 * w;
    uVar2 = 0x80 - uVar7;
    uVar3 = (int)uVar9 >> 0x1f & uVar9;
    lVar8 = 0;
    while (0 < (int)((int)lVar8 + uVar9)) {
      uVar4 = w;
      if (lVar8 == 0) {
        uVar4 = uVar2;
      }
      uVar4 = secp256k1_scalar_get_bits_var(s,uVar7,uVar4);
      if (uVar4 != 0) {
        uVar3 = (int)lVar8 + uVar9;
        break;
      }
      wnaf[(ulong)uVar9 + lVar8] = 0;
      uVar7 = uVar7 - w;
      lVar8 = lVar8 + -1;
    }
    iVar1 = -1 << ((byte)w & 0x1f);
    uVar6 = 0;
    if (0 < (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
    uVar3 = w;
    for (uVar11 = 1; uVar11 - uVar6 != 1; uVar11 = uVar11 + 1) {
      uVar7 = w;
      if (uVar9 == uVar11) {
        uVar7 = uVar2;
      }
      uVar7 = secp256k1_scalar_get_bits_var(s,uVar3,uVar7);
      if ((uVar7 & 1) == 0) {
        wnaf[uVar11 - 1] = wnaf[uVar11 - 1] + iVar1;
        uVar7 = uVar7 | 1;
      }
      wnaf[uVar11] = uVar7;
      if (1 < uVar11) {
        if (wnaf[uVar11 - 1] == -1) {
          if (0 < wnaf[uVar11 - 2]) {
            iVar5 = wnaf[uVar11 - 2] + iVar1;
            goto LAB_00135644;
          }
        }
        else if ((wnaf[uVar11 - 1] == 1) && (wnaf[uVar11 - 2] < 0)) {
          iVar5 = wnaf[uVar11 - 2] + (1 << ((byte)w & 0x1f));
LAB_00135644:
          wnaf[uVar11 - 2] = iVar5;
          wnaf[uVar11 - 1] = 0;
        }
      }
      uVar3 = uVar3 + w;
    }
  }
  else {
    uVar6 = (long)(w + 0x7f) / (long)w;
    uVar10 = 0;
    uVar11 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar11 = 0;
    }
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      wnaf[uVar6] = 0;
    }
  }
  return uVar10;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}